

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTerminatorSymbol::IfcTerminatorSymbol
          (IfcTerminatorSymbol *this,void **vtt)

{
  void *pvVar1;
  
  IfcAnnotationSymbolOccurrence::IfcAnnotationSymbolOccurrence
            (&this->super_IfcAnnotationSymbolOccurrence,vtt + 1);
  pvVar1 = vtt[0x17];
  *(void **)&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.field_0x90 =
       pvVar1;
  *(void **)(&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.field_0x90 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x18];
  *(undefined8 *)&(this->super_IfcAnnotationSymbolOccurrence).field_0x98 = 0;
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
             super_IfcStyledItem = pvVar1;
  *(void **)(&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
              super_IfcStyledItem.field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x19];
  (this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1a];
  *(void **)&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
             super_IfcStyledItem.field_0x70 = vtt[0x1b];
  *(void **)&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
             super_IfcStyledItem.field_0x80 = vtt[0x1c];
  *(void **)&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.field_0x90 =
       vtt[0x1d];
  *(undefined8 *)&(this->super_IfcAnnotationSymbolOccurrence).field_0xa0 = 0;
  return;
}

Assistant:

IfcTerminatorSymbol() : Object("IfcTerminatorSymbol") {}